

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O0

char * libj1939_addr2str(sockaddr_can *can)

{
  int iVar1;
  char *pcVar2;
  long in_RDI;
  char *ifname;
  char *str;
  char *local_10;
  
  local_10 = libj1939_addr2str::buf;
  if (*(int *)(in_RDI + 4) != 0) {
    pcVar2 = libj1939_ifnam((int)((ulong)in_RDI >> 0x20));
    if (pcVar2 == (char *)0x0) {
      iVar1 = sprintf(libj1939_addr2str::buf,"#%i:",(ulong)*(uint *)(in_RDI + 4));
    }
    else {
      iVar1 = sprintf(libj1939_addr2str::buf,"%s:",pcVar2);
    }
    local_10 = libj1939_addr2str::buf + iVar1;
  }
  if (*(long *)(in_RDI + 8) == 0) {
    if (*(byte *)(in_RDI + 0x14) < 0xff) {
      iVar1 = sprintf(local_10,"%02x",(ulong)*(byte *)(in_RDI + 0x14));
    }
    else {
      iVar1 = sprintf(local_10,"-");
    }
    local_10 = local_10 + iVar1;
  }
  else {
    iVar1 = sprintf(local_10,"%016llx",*(undefined8 *)(in_RDI + 8));
    local_10 = local_10 + iVar1;
    if (*(int *)(in_RDI + 0x10) == 0xee00) {
      iVar1 = sprintf(local_10,".%02x",(ulong)*(byte *)(in_RDI + 0x14));
      local_10 = local_10 + iVar1;
    }
  }
  if (*(uint *)(in_RDI + 0x10) < 0x40000) {
    sprintf(local_10,",%05x",(ulong)*(uint *)(in_RDI + 0x10));
  }
  return libj1939_addr2str::buf;
}

Assistant:

const char *libj1939_addr2str(const struct sockaddr_can *can)
{
	char *str;
	static char buf[128];

	str = buf;
	if (can->can_ifindex) {
		const char *ifname;
		ifname = libj1939_ifnam(can->can_ifindex);
		if (!ifname)
			str += sprintf(str, "#%i:", can->can_ifindex);
		else
			str += sprintf(str, "%s:", ifname);
	}
	if (can->can_addr.j1939.name) {
		str += sprintf(str, "%016llx", (unsigned long long)can->can_addr.j1939.name);
		if (can->can_addr.j1939.pgn == J1939_PGN_ADDRESS_CLAIMED)
			str += sprintf(str, ".%02x", can->can_addr.j1939.addr);
	} else if (can->can_addr.j1939.addr <= 0xfe)
		str += sprintf(str, "%02x", can->can_addr.j1939.addr);
	else
		str += sprintf(str, "-");
	if (can->can_addr.j1939.pgn <= J1939_PGN_MAX)
		str += sprintf(str, ",%05x", can->can_addr.j1939.pgn);

	return buf;
}